

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  idx_t iVar14;
  bool bVar15;
  ExponentData exponent;
  IntegerCastData<short> local_7a;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  DecimalCastData<duckdb::hugeint_t> local_60;
  hugeint_t *local_38;
  
  bVar3 = false;
  local_38 = result;
  hugeint_t::hugeint_t(&local_60.result,0);
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,width) << 4);
  local_60.digit_count = '\0';
  local_60.decimal_count = '\0';
  local_60.round_set = false;
  local_60.should_round = false;
  local_60.excessive_decimals = '\0';
  local_60.exponent_type = NONE;
  local_60.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar13);
  local_60.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar13 + 8);
  if (string_size == 0) goto LAB_0151f5b1;
  uVar13 = 0;
  do {
    bVar1 = string_ptr[uVar13];
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
      local_60.width = width;
      local_60.scale = scale;
      if (bVar1 == 0x2d) {
        local_78 = string_size - uVar13;
        uVar10 = 1;
        goto LAB_0151f049;
      }
      if (bVar1 == 0x30 && string_size - 1 != uVar13) {
        bVar2 = string_ptr[uVar13 + 1];
        if (bVar2 < 0x62) {
          if ((bVar2 == 0x42) || (bVar2 == 0x58)) {
LAB_0151f1ea:
            if (0xfffffffffffffffd < (string_size - uVar13) - 3) {
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                        (&local_60);
            }
            break;
          }
        }
        else if ((bVar2 == 0x62) || (bVar2 == 0x78)) goto LAB_0151f1ea;
      }
      local_78 = string_size - uVar13;
      local_70 = (ulong)(bVar1 == 0x2b);
      uVar10 = local_70;
      goto LAB_0151f222;
    }
    uVar13 = uVar13 + 1;
  } while (string_size != uVar13);
  goto LAB_0151f5ae;
  while( true ) {
    bVar1 = string_ptr[uVar13 + uVar10] - 0x30;
    if (9 < bVar1) {
      if (string_ptr[uVar13 + uVar10] != ',') goto LAB_0151f3bc;
      uVar11 = uVar10 + 1;
      iVar5 = 3;
      uVar8 = uVar11;
      if (local_78 <= uVar11) goto LAB_0151f399;
      goto LAB_0151f155;
    }
    uVar11 = uVar10 + 1;
    bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60,bVar1);
    if (bVar3) {
      bVar15 = true;
      if ((~uVar10 + string_size != uVar13) && (string_ptr[uVar13 + 1 + uVar10] == '_')) {
        uVar11 = uVar10 + 2;
        if ((string_size - uVar10) - 2 == uVar13) {
          bVar15 = false;
        }
        else {
          bVar15 = (byte)(string_ptr[uVar13 + uVar11] - 0x30U) < 10;
        }
      }
    }
    else {
      bVar15 = false;
    }
    bVar3 = false;
    uVar10 = uVar11;
    if (!bVar15) break;
LAB_0151f049:
    if (local_78 <= uVar10) goto LAB_0151f112;
  }
  goto LAB_0151f5b1;
  while( true ) {
    uVar9 = uVar8 + 1;
    if ((~uVar8 + string_size != uVar13) && (string_ptr[uVar13 + 1 + uVar8] == '_')) {
      lVar7 = string_size - uVar8;
      uVar9 = uVar8 + 2;
      uVar8 = uVar9;
      iVar4 = 1;
      if ((lVar7 - 2U == uVar13) || (9 < (byte)(string_ptr[uVar13 + uVar9] - 0x30U)))
      goto LAB_0151f3ab;
    }
    uVar8 = uVar9;
    uVar11 = local_70;
    if (local_78 <= uVar9) break;
LAB_0151f155:
    local_70 = uVar11;
    if (9 < (byte)(string_ptr[uVar13 + uVar8] - 0x30U)) {
      iVar5 = 0;
      uVar11 = local_70;
      goto LAB_0151f399;
    }
    bVar3 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                      (&local_60,string_ptr[uVar13 + uVar8] - 0x30U);
    if (!bVar3) {
      iVar4 = 1;
      goto LAB_0151f3ab;
    }
  }
  iVar5 = 3;
LAB_0151f399:
  iVar4 = 1;
  if (uVar11 < uVar8) {
    iVar4 = iVar5;
  }
  if (1 < uVar10) {
    iVar4 = iVar5;
  }
LAB_0151f3ab:
  uVar10 = uVar8;
  if (iVar4 != 3) {
    if (iVar4 != 0) goto LAB_0151f5ae;
LAB_0151f3bc:
    bVar1 = string_ptr[uVar13 + uVar10];
    bVar3 = false;
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) goto LAB_0151f5b1;
    }
    else {
      if ((bVar1 == 0x65) || (uVar6 == 0x45)) {
        if ((uVar10 != 1) && (uVar10 + 1 < local_78)) {
          local_7a.result = 0;
          pcVar12 = string_ptr + uVar13 + uVar10 + 1;
          iVar14 = ~uVar13 + (string_size - uVar10);
          bVar3 = SUB81(uVar10 + 1,0);
          if (*pcVar12 == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar12,iVar14,&local_7a,bVar3);
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar12,iVar14,&local_7a,bVar3);
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::
                    HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                              (&local_60,(int)local_7a.result);
            goto LAB_0151f5b1;
          }
        }
        goto LAB_0151f5ae;
      }
      if (uVar6 != 0x20) goto LAB_0151f5b1;
    }
    uVar11 = uVar10 + 1;
    uVar10 = uVar11;
    if (uVar11 < local_78) {
      do {
        if ((4 < (byte)string_ptr[uVar13 + uVar11] - 9) && (string_ptr[uVar13 + uVar11] != 0x20))
        goto LAB_0151f5ae;
        uVar11 = uVar11 + 1;
        uVar10 = local_78;
      } while (local_78 != uVar11);
    }
  }
LAB_0151f112:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_60)
  ;
  if (bVar3) {
    bVar3 = 1 < uVar10;
    goto LAB_0151f5b1;
  }
  goto LAB_0151f5ae;
  while( true ) {
    bVar1 = string_ptr[uVar13 + uVar10] - 0x30;
    if (9 < bVar1) {
      if (string_ptr[uVar13 + uVar10] != ',') goto LAB_0151f4ac;
      uVar11 = uVar10 + 1;
      iVar5 = 3;
      uVar8 = uVar11;
      if (local_78 <= uVar11) goto LAB_0151f488;
      goto LAB_0151f2ed;
    }
    uVar11 = uVar10 + 1;
    bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_60,bVar1);
    if (bVar3) {
      bVar15 = true;
      if ((~uVar10 + string_size != uVar13) && (string_ptr[uVar13 + 1 + uVar10] == '_')) {
        uVar11 = uVar10 + 2;
        if ((string_size - uVar10) - 2 == uVar13) {
          bVar15 = false;
        }
        else {
          bVar15 = (byte)(string_ptr[uVar13 + uVar11] - 0x30U) < 10;
        }
      }
    }
    else {
      bVar15 = false;
    }
    bVar3 = false;
    uVar10 = uVar11;
    if (!bVar15) break;
LAB_0151f222:
    if (local_78 <= uVar10) goto LAB_0151f2a9;
  }
  goto LAB_0151f5b1;
  while( true ) {
    uVar9 = uVar8 + 1;
    if ((~uVar8 + string_size != uVar13) && (string_ptr[uVar13 + 1 + uVar8] == '_')) {
      lVar7 = string_size - uVar8;
      uVar9 = uVar8 + 2;
      uVar8 = uVar9;
      iVar4 = 1;
      if ((lVar7 - 2U == uVar13) || (9 < (byte)(string_ptr[uVar13 + uVar9] - 0x30U)))
      goto LAB_0151f49b;
    }
    uVar8 = uVar9;
    uVar11 = local_68;
    if (local_78 <= uVar9) break;
LAB_0151f2ed:
    local_68 = uVar11;
    if (9 < (byte)(string_ptr[uVar13 + uVar8] - 0x30U)) {
      iVar5 = 0;
      uVar11 = local_68;
      goto LAB_0151f488;
    }
    bVar3 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                      (&local_60,string_ptr[uVar13 + uVar8] - 0x30U);
    if (!bVar3) {
      iVar4 = 1;
      goto LAB_0151f49b;
    }
  }
  iVar5 = 3;
LAB_0151f488:
  iVar4 = 1;
  if (uVar11 < uVar8) {
    iVar4 = iVar5;
  }
  if (local_70 < uVar10) {
    iVar4 = iVar5;
  }
LAB_0151f49b:
  uVar10 = uVar8;
  if (iVar4 != 3) {
    if (iVar4 != 0) goto LAB_0151f5ae;
LAB_0151f4ac:
    bVar1 = string_ptr[uVar13 + uVar10];
    bVar3 = false;
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) goto LAB_0151f5b1;
    }
    else {
      if ((bVar1 == 0x65) || (uVar6 == 0x45)) {
        if ((uVar10 != local_70) && (uVar10 + 1 < local_78)) {
          local_7a.result = 0;
          pcVar12 = string_ptr + uVar13 + uVar10 + 1;
          iVar14 = ~uVar13 + (string_size - uVar10);
          bVar3 = SUB81(uVar10 + 1,0);
          if (*pcVar12 == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar12,iVar14,&local_7a,bVar3);
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar12,iVar14,&local_7a,bVar3);
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::
                    HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                              (&local_60,(int)local_7a.result);
            goto LAB_0151f5b1;
          }
        }
        goto LAB_0151f5ae;
      }
      if (uVar6 != 0x20) goto LAB_0151f5b1;
    }
    uVar11 = uVar10 + 1;
    uVar10 = uVar11;
    if (uVar11 < local_78) {
      do {
        if ((4 < (byte)string_ptr[uVar13 + uVar11] - 9) && (string_ptr[uVar13 + uVar11] != 0x20))
        goto LAB_0151f5ae;
        uVar11 = uVar11 + 1;
        uVar10 = local_78;
      } while (local_78 != uVar11);
    }
  }
LAB_0151f2a9:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                    (&local_60);
  if (bVar3) {
    bVar3 = local_70 < uVar10;
    goto LAB_0151f5b1;
  }
LAB_0151f5ae:
  bVar3 = false;
LAB_0151f5b1:
  if (bVar3 != false) {
    local_38->lower = local_60.result.lower;
    local_38->upper = local_60.result.upper;
  }
  return bVar3;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}